

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack16to4.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_pack16to4_avx512
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  undefined4 *puVar6;
  uint _w;
  ulong uVar7;
  int i;
  long lVar8;
  void *pvVar9;
  ulong uVar10;
  undefined4 *puVar11;
  ulong uVar12;
  int i_2;
  undefined4 *puVar13;
  long lVar14;
  ulong uVar15;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  uVar12 = 0;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  Mat::create(kernel_tm,_w * 0x100,inch / 0x10,
              (int)(char)((char)(outch % 8) / '\x04') +
              (int)(char)((char)(outch % 0x10) / '\b') + outch / 0x10,4,(Allocator *)0x0);
  pvVar1 = kernel_tm->data;
  sVar2 = kernel_tm->cstep;
  sVar3 = kernel_tm->elemsize;
  uVar7 = (ulong)_w;
  if ((int)_w < 1) {
    uVar7 = uVar12;
  }
  lVar4 = (long)inch;
  lVar5 = (long)outch;
  for (; (long)(uVar12 | 0xf) < lVar5; uVar12 = uVar12 + 0x10) {
    pvVar9 = (void *)((uVar12 >> 4) * sVar2 * sVar3 + (long)pvVar1);
    for (uVar10 = 0; (long)(uVar10 | 0xf) < lVar4; uVar10 = uVar10 + 0x10) {
      puVar6 = (undefined4 *)
               (((long)local_78.w * uVar10 + uVar12 * local_78.cstep) * local_78.elemsize +
               (long)local_78.data);
      for (uVar15 = 0; uVar15 != uVar7; uVar15 = uVar15 + 1) {
        puVar11 = puVar6;
        for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
          puVar13 = puVar11;
          for (lVar14 = 0; lVar14 != 0x40; lVar14 = lVar14 + 4) {
            *(undefined4 *)((long)pvVar9 + lVar14) = *puVar13;
            puVar13 = (undefined4 *)((long)puVar13 + local_78.cstep * local_78.elemsize);
          }
          puVar11 = (undefined4 *)((long)puVar11 + local_78.elemsize * (long)local_78.w);
          pvVar9 = (void *)((long)pvVar9 + 0x40);
        }
        puVar6 = puVar6 + 1;
      }
    }
  }
  pvVar1 = kernel_tm->data;
  sVar2 = kernel_tm->cstep;
  sVar3 = kernel_tm->elemsize;
  for (; (long)(uVar12 | 7) < lVar5; uVar12 = uVar12 + 8) {
    pvVar9 = (void *)((ulong)(((uint)(uVar12 >> 4) & 0xfffffff) +
                             (uint)(((uint)uVar12 >> 3 & 1) != 0)) * sVar2 * sVar3 + (long)pvVar1);
    for (uVar10 = 0; (long)(uVar10 | 0xf) < lVar4; uVar10 = uVar10 + 0x10) {
      puVar6 = (undefined4 *)
               (((long)local_78.w * uVar10 + uVar12 * local_78.cstep) * local_78.elemsize +
               (long)local_78.data);
      for (uVar15 = 0; uVar15 != uVar7; uVar15 = uVar15 + 1) {
        puVar11 = puVar6;
        for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
          puVar13 = puVar11;
          for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 4) {
            *(undefined4 *)((long)pvVar9 + lVar14) = *puVar13;
            puVar13 = (undefined4 *)((long)puVar13 + local_78.cstep * local_78.elemsize);
          }
          puVar11 = (undefined4 *)((long)puVar11 + local_78.elemsize * (long)local_78.w);
          pvVar9 = (void *)((long)pvVar9 + 0x20);
        }
        puVar6 = puVar6 + 1;
      }
    }
  }
  pvVar1 = kernel_tm->data;
  sVar2 = kernel_tm->cstep;
  sVar3 = kernel_tm->elemsize;
  for (; (long)(uVar12 | 3) < lVar5; uVar12 = uVar12 + 4) {
    pvVar9 = (void *)((ulong)(((uint)(uVar12 >> 3) & 1) + ((uint)(uVar12 >> 4) & 0xfffffff) +
                             (uint)(((uint)uVar12 >> 2 & 1) != 0)) * sVar2 * sVar3 + (long)pvVar1);
    for (uVar10 = 0; (long)(uVar10 | 0xf) < lVar4; uVar10 = uVar10 + 0x10) {
      puVar6 = (undefined4 *)
               (((long)local_78.w * uVar10 + uVar12 * local_78.cstep) * local_78.elemsize +
               (long)local_78.data);
      for (uVar15 = 0; uVar15 != uVar7; uVar15 = uVar15 + 1) {
        puVar11 = puVar6;
        for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
          puVar13 = puVar11;
          for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
            *(undefined4 *)((long)pvVar9 + lVar14) = *puVar13;
            puVar13 = (undefined4 *)((long)puVar13 + local_78.cstep * local_78.elemsize);
          }
          puVar11 = (undefined4 *)((long)puVar11 + local_78.elemsize * (long)local_78.w);
          pvVar9 = (void *)((long)pvVar9 + 0x10);
        }
        puVar6 = puVar6 + 1;
      }
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 16b-16a-maxk-inch/16a-outch/8b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(16 * 16 * maxk, inch / 16, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4, (size_t)4u);

    int q = 0;
    for (; q + 15 < outch; q += 16)
    {
        float* g00 = kernel_tm.channel(q / 16);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 16; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
    for (; q + 7 < outch; q += 8)
    {
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8 + (q % 8) / 4);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}